

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line_test.cpp
# Opt level: O1

void __thiscall license::test::issue_license_help::test_method(issue_license_help *this)

{
  long lVar1;
  string stdout_str;
  char *argv1 [4];
  output_test_stream output;
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  undefined8 local_258;
  shared_count sStack_250;
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  char *local_238;
  char *pcStack_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined **local_1c0;
  undefined1 local_1b8;
  undefined1 *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  output_test_stream local_1a0 [384];
  
  local_238 = "issue";
  pcStack_230 = "-h";
  local_248 = 0x4831f3;
  uStack_244 = 0;
  uStack_240 = 0x483de5;
  uStack_23c = 0;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(local_1a0,&local_1d0,1,1);
  local_280._0_8_ = std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  CommandLineParser::parseCommandLine(4,(char **)&local_248);
  cout_redirect::~cout_redirect((cout_redirect *)local_280);
  std::__cxx11::stringbuf::str();
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/command-line_test.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x89);
  lVar1 = std::__cxx11::string::find((char *)local_280,0x4832e2,0);
  local_260[0] = lVar1 != -1;
  local_258 = 0;
  sStack_250.pi_ = (sp_counted_base *)0x0;
  std::operator+(&local_220,"command help was print out ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280);
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_005c4460;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/command-line_test.cpp"
  ;
  local_1f8 = "";
  local_1a8 = &local_220;
  boost::test_tools::tt_detail::report_assertion(local_260,&local_1c0,&local_200,0x89,1,1,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  boost::detail::shared_count::~shared_count(&sStack_250);
  if ((streambuf *)local_280._0_8_ != (streambuf *)(local_280 + 0x10)) {
    operator_delete((void *)local_280._0_8_);
  }
  boost::test_tools::output_test_stream::~output_test_stream(local_1a0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(issue_license_help) {
	int argc = 4;
	const char* argv1[] = {"lcc", "license", "issue", "-h"};
	// initialize_project
	boost::test_tools::output_test_stream output;
	{
		cout_redirect guard(output.rdbuf());
		int result = CommandLineParser::parseCommandLine(argc, argv1);
	}
	string stdout_str = output.str();
	BOOST_CHECK_MESSAGE(stdout_str.find(PARAM_CLIENT_SIGNATURE) != string::npos,
						"command help was print out " + stdout_str);
}